

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O0

int anon_unknown.dwarf_9840::GetParameters(FILE *fp,int *fs,int *nbit,int *wav_length)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  int local_40;
  int i_1;
  int i;
  undefined1 auStack_34 [3];
  uchar for_int_number [4];
  char data_check [5];
  int *wav_length_local;
  int *nbit_local;
  int *fs_local;
  FILE *fp_local;
  
  unique0x100001db = wav_length;
  memset((void *)((long)&i + 3),0,5);
  for_int_number[0] = '\0';
  fread((void *)((long)&i_1 + 3),1,4,(FILE *)fp);
  *fs = 0;
  for (local_40 = 3; -1 < local_40; local_40 = local_40 + -1) {
    *fs = *fs * 0x100 + (uint)*(byte *)((long)&i_1 + (long)local_40 + 3);
  }
  fseek((FILE *)fp,6,1);
  fread((void *)((long)&i_1 + 3),1,2,(FILE *)fp);
  *nbit = (uint)i_1._3_1_;
  while (sVar2 = fread((void *)((long)&i + 3),1,1,(FILE *)fp), sVar2 != 0) {
    if (i._3_1_ == 'd') {
      fread(auStack_34,1,3,(FILE *)fp);
      iVar1 = strcmp((char *)((long)&i + 3),"data");
      if (iVar1 == 0) break;
      fseek((FILE *)fp,-3,1);
    }
  }
  iVar1 = strcmp((char *)((long)&i + 3),"data");
  if (iVar1 == 0) {
    fread((void *)((long)&i_1 + 3),1,4,(FILE *)fp);
    *stack0xffffffffffffffd0 = 0;
    for (local_44 = 3; -1 < local_44; local_44 = local_44 + -1) {
      *stack0xffffffffffffffd0 =
           *stack0xffffffffffffffd0 * 0x100 + (uint)*(byte *)((long)&i_1 + (long)local_44 + 3);
    }
    *stack0xffffffffffffffd0 = *stack0xffffffffffffffd0 / (*nbit / 8);
    fp_local._4_4_ = 1;
  }
  else {
    printf("data error.\n");
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

static int GetParameters(FILE *fp, int *fs, int *nbit, int *wav_length) {
  char data_check[5] = {0};
  data_check[4] = '\0';
  unsigned char for_int_number[4];
  fread(for_int_number, 1, 4, fp);
  *fs = 0;
  for (int i = 3; i >= 0; --i) *fs = *fs * 256 + for_int_number[i];
  // Quantization
  fseek(fp, 6, SEEK_CUR);
  fread(for_int_number, 1, 2, fp);
  *nbit = for_int_number[0];

  // Skip until "data" is found. 2011/03/28
  while (0 != fread(data_check, 1, 1, fp)) {
    if (data_check[0] == 'd') {
      fread(&data_check[1], 1, 3, fp);
      if (0 != strcmp(data_check, "data"))
        fseek(fp, -3, SEEK_CUR);
      else
        break;
    }
  }
  if (0 != strcmp(data_check, "data")) {
    printf("data error.\n");
    return 0;
  }

  fread(for_int_number, 1, 4, fp);  // "data"
  *wav_length = 0;
  for (int i = 3; i >= 0; --i)
    *wav_length = *wav_length * 256 + for_int_number[i];
  *wav_length /= (*nbit / 8);
  return 1;
}